

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNameTreeObjectHelper.cc
# Opt level: O2

iterator * __thiscall
QPDFNameTreeObjectHelper::insert
          (iterator *__return_storage_ptr__,QPDFNameTreeObjectHelper *this,string *key,
          QPDFObjectHandle *value)

{
  NNTreeImpl *this_00;
  iterator i;
  undefined1 auStack_b8 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  iterator local_88;
  
  this_00 = (((this->m).
              super___shared_ptr<QPDFNameTreeObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->impl).super___shared_ptr<NNTreeImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  QPDFObjectHandle::newUnicodeString((QPDFObjectHandle *)(auStack_b8 + 0x20),key);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(auStack_b8 + 0x10),
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)value);
  NNTreeImpl::insert(&local_88,this_00,(QPDFObjectHandle *)(auStack_b8 + 0x20),
                     (QPDFObjectHandle *)(auStack_b8 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_b8 + 0x18));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90);
  std::make_shared<NNTreeIterator,NNTreeIterator&>((NNTreeIterator *)auStack_b8);
  iterator::iterator(__return_storage_ptr__,(shared_ptr<NNTreeIterator> *)auStack_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_b8 + 8));
  NNTreeIterator::~NNTreeIterator(&local_88);
  return __return_storage_ptr__;
}

Assistant:

QPDFNameTreeObjectHelper::iterator
QPDFNameTreeObjectHelper::insert(std::string const& key, QPDFObjectHandle value)
{
    auto i = m->impl->insert(QPDFObjectHandle::newUnicodeString(key), value);
    return {std::make_shared<NNTreeIterator>(i)};
}